

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall glslang::HlslGrammar::acceptControlDeclaration(HlslGrammar *this,TIntermNode **node)

{
  bool bVar1;
  TIntermNode *pTVar2;
  char *syntax;
  TIntermTyped *expressionNode;
  TAttributes attributes;
  HlslToken idToken;
  TType type;
  
  *node = (TIntermNode *)0x0;
  attributes.super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl.super__Node_alloc_type.allocator = GetThreadPoolAllocator();
  attributes.super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl._M_node.super__List_node_base._M_next =
       &attributes.
        super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
        super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
        ._M_impl._M_node.super__List_node_base;
  attributes.super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl._M_node._M_size = 0;
  attributes.super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl._M_node.super__List_node_base._M_prev =
       attributes.
       super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
       super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  TType::TType(&type,EbtVoid,EvqTemporary,1,0,0,false);
  bVar1 = acceptFullySpecifiedType(this,&type,&attributes);
  if (bVar1) {
    if (attributes.
        super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
        super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
        ._M_impl._M_node._M_size != 0) {
      (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
        [0x2e])(this->parseContext,&(this->super_HlslTokenStream).token,
                "attributes don\'t apply to control declaration","","");
    }
    bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
    if (bVar1) {
      HlslTokenStream::recedeToken(&this->super_HlslTokenStream);
    }
    else {
      idToken.field_2.string = (TString *)0x0;
      idToken.loc.name = (TString *)0x0;
      idToken.loc.string = 0;
      idToken.loc.line = 0;
      idToken.loc.column = 0;
      bVar1 = acceptIdentifier(this,&idToken);
      if (bVar1) {
        expressionNode = (TIntermTyped *)0x0;
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokAssign);
        if (bVar1) {
          bVar1 = acceptExpression(this,&expressionNode);
          if (bVar1) {
            pTVar2 = HlslParseContext::declareVariable
                               (this->parseContext,&idToken.loc,idToken.field_2.string,&type,
                                expressionNode);
            *node = pTVar2;
            return true;
          }
          syntax = "initializer";
        }
        else {
          syntax = "=";
        }
      }
      else {
        syntax = "identifier";
      }
      expected(this,syntax);
    }
  }
  return false;
}

Assistant:

bool HlslGrammar::acceptControlDeclaration(TIntermNode*& node)
{
    node = nullptr;
    TAttributes attributes;

    // fully_specified_type
    TType type;
    if (! acceptFullySpecifiedType(type, attributes))
        return false;

    if (attributes.size() > 0)
        parseContext.warn(token.loc, "attributes don't apply to control declaration", "", "");

    // filter out type casts
    if (peekTokenClass(EHTokLeftParen)) {
        recedeToken();
        return false;
    }

    // identifier
    HlslToken idToken;
    if (! acceptIdentifier(idToken)) {
        expected("identifier");
        return false;
    }

    // EQUAL
    TIntermTyped* expressionNode = nullptr;
    if (! acceptTokenClass(EHTokAssign)) {
        expected("=");
        return false;
    }

    // expression
    if (! acceptExpression(expressionNode)) {
        expected("initializer");
        return false;
    }

    node = parseContext.declareVariable(idToken.loc, *idToken.string, type, expressionNode);

    return true;
}